

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_Generic_Door(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4
                   )

{
  bool bVar1;
  EVlDoor local_3c;
  int iStack_38;
  bool boomgen;
  EVlDoor type;
  int lightTag;
  int tag;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  switch(arg2 & 0x3f) {
  case 0:
    local_3c = doorRaise;
    break;
  case 1:
    local_3c = doorOpen;
    break;
  case 2:
    local_3c = doorCloseWaitOpen;
    break;
  case 3:
    local_3c = doorClose;
    break;
  default:
    return 0;
  }
  if ((arg2 & 0x80U) == 0) {
    iStack_38 = 0;
    type = arg0;
  }
  else {
    type = doorClose;
    iStack_38 = arg0;
  }
  bVar1 = EV_DoDoor(local_3c,(line_t_conflict *)ln,it,type,(double)arg1 / 8.0,(arg3 * 0x23) / 8,arg4
                    ,iStack_38,(arg2 & 0x40U) != 0,0);
  return (uint)bVar1;
}

Assistant:

FUNC(LS_Generic_Door)
// Generic_Door (tag, speed, kind, delay, lock)
{
	int tag, lightTag;
	DDoor::EVlDoor type;
	bool boomgen = false;

	switch (arg2 & 63)
	{
		case 0: type = DDoor::doorRaise;			break;
		case 1: type = DDoor::doorOpen;				break;
		case 2: type = DDoor::doorCloseWaitOpen;	break;
		case 3: type = DDoor::doorClose;			break;
		default: return false;
	}
	// Boom doesn't allow manual generalized doors to be activated while they move
	if (arg2 & 64) boomgen = true;
	if (arg2 & 128)
	{
		// New for 2.0.58: Finally support BOOM's local door light effect
		tag = 0;
		lightTag = arg0;
	}
	else
	{
		tag = arg0;
		lightTag = 0;
	}
	return EV_DoDoor (type, ln, it, tag, SPEED(arg1), OCTICS(arg3), arg4, lightTag, boomgen);
}